

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O2

void helper_csch(CPUS390XState_conflict *env,uint64_t r1)

{
  return;
}

Assistant:

void HELPER(csch)(CPUS390XState *env, uint64_t r1)
{
#if 0
    S390CPU *cpu = env_archcpu(env);
    qemu_mutex_lock_iothread();
    ioinst_handle_csch(cpu, r1, GETPC());
    qemu_mutex_unlock_iothread();
#endif
}